

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_nil(FuncState *fs,int from,int n)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  int pl;
  int pfrom;
  int l;
  Instruction *previous;
  int n_local;
  int from_local;
  FuncState *fs_local;
  
  pl = from + n + -1;
  if ((fs->lasttarget < fs->pc) && (puVar3 = fs->f->code + (fs->pc + -1), (*puVar3 & 0x3f) == 4)) {
    uVar1 = *puVar3 >> 6 & 0xff;
    iVar2 = uVar1 + (*puVar3 >> 0x17);
    if ((((int)uVar1 <= from) && (from <= iVar2 + 1)) ||
       ((from <= (int)uVar1 && ((int)uVar1 <= from + n)))) {
      previous._4_4_ = from;
      if ((int)uVar1 < from) {
        previous._4_4_ = uVar1;
      }
      if (pl < iVar2) {
        pl = iVar2;
      }
      *puVar3 = *puVar3 & 0xffffc03f | (previous._4_4_ & 0xff) << 6;
      *puVar3 = *puVar3 & 0x7fffff | (pl - previous._4_4_) * 0x800000;
      return;
    }
  }
  luaK_codeABC(fs,OP_LOADNIL,from,n + -1,0);
  return;
}

Assistant:

void luaK_nil(FuncState *fs, int from, int n) {
    Instruction *previous;
    int l = from + n - 1;  /* last register to set nil */
    if (fs->pc > fs->lasttarget) {  /* no jumps to current position? */
        previous = &fs->f->code[fs->pc - 1];
        if (GET_OPCODE(*previous) == OP_LOADNIL) {  /* previous is LOADNIL? */
            int pfrom = GETARG_A(*previous);  /* get previous range */
            int pl = pfrom + GETARG_B(*previous);
            if ((pfrom <= from && from <= pl + 1) ||
                (from <= pfrom && pfrom <= l + 1)) {  /* can connect both? */
                if (pfrom < from) from = pfrom;  /* from = min(from, pfrom) */
                if (pl > l) l = pl;  /* l = max(l, pl) */
                SETARG_A(*previous, from);
                SETARG_B(*previous, l - from);
                return;
            }
        }  /* else go through */
    }
    luaK_codeABC(fs, OP_LOADNIL, from, n - 1, 0);  /* else no optimization */
}